

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

CHAR CNNModelPredictBinary0DQ(CharCNNClassifier *model,IplImage *pImage)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  CharCNNClassifier *pCVar4;
  CHAR CVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  INT32U IVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uStack_80;
  long local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  int local_4c;
  ulong local_48;
  CharCNNClassifier *local_40;
  ulong local_38;
  
  uVar6 = (model->model_binary_0DQ).C11.outChannels;
  lVar3 = -0x78 - ((ulong)(uVar6 * 0xa9) * 4 + 0xf & 0xfffffffffffffff0);
  local_58 = (long)&local_78 +
             (lVar3 - ((ulong)(model->model_binary_0DQ).FC1.inputNum * 4 + 0xf & 0xfffffffffffffff0)
             ) + 0x78;
  local_40 = model;
  lVar10 = local_58 -
           ((ulong)(model->model_binary_0DQ).FC1.outputNum * 4 + 0xf & 0xfffffffffffffff0);
  local_60 = lVar10;
  local_38 = 0;
  uVar7 = 0;
  while (uVar7 < uVar6) {
    local_4c = Binary0DQ_C11_B_Weight[uVar7];
    local_68 = (long)&local_78 + ((long)(uVar7 * 0xa900000000) >> 0x1e) + lVar3 + 0x78;
    local_70 = uVar7;
    uVar7 = 0;
    while (uVar7 != 0xd) {
      local_78 = uVar7 * 0x34 + local_68;
      local_48 = uVar7;
      for (lVar12 = 0; lVar12 != 0xd; lVar12 = lVar12 + 1) {
        iVar14 = 0;
        uVar7 = local_48;
        for (IVar9 = 0; IVar9 != (local_40->model_binary_0DQ).C11.height; IVar9 = IVar9 + 1) {
          uVar6 = (local_40->model_binary_0DQ).C11.widthStep;
          for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
            iVar14 = iVar14 + (uint)pImage->imageData
                                    [(int)(pImage->widthStep * (int)uVar7 + (int)lVar12 +
                                          (int)uVar16)] *
                              Binary0DQ_C11_Map_Weight
                              [(int)(uVar6 * IVar9 + (int)local_38 + (int)uVar16)];
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        iVar14 = iVar14 + local_4c;
        *(undefined8 *)(lVar10 + -8) = 0x10259b;
        iVar14 = TanhApproximateFunction(iVar14);
        *(int *)(local_78 + lVar12 * 4) = iVar14;
      }
      uVar7 = local_48 + 1;
    }
    uVar6 = (local_40->model_binary_0DQ).C11.outChannels;
    local_38 = (ulong)((int)local_38 + 9);
    uVar7 = local_70 + 1;
  }
  uVar16 = 0;
  *(undefined8 *)(lVar10 + -8) = 0xfffffffffffffff6;
  pCVar4 = local_40;
  lVar12 = local_60;
  uVar7 = *(ulong *)(lVar10 + -8);
  for (uVar15 = 0; uVar15 != uVar6; uVar15 = uVar15 + 1) {
    local_48 = uVar15;
    local_38 = uVar16;
    uVar8 = uVar16;
    for (lVar19 = 0; lVar19 != 6; lVar19 = lVar19 + 1) {
      uVar17 = uVar8;
      for (lVar21 = 0; lVar21 != 6; lVar21 = lVar21 + 1) {
        uVar20 = uVar7 & 0xffffffff;
        uVar13 = uVar17;
        for (iVar14 = 0; iVar14 != 2; iVar14 = iVar14 + 1) {
          for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
            uVar1 = *(uint *)((long)&local_78 + (long)((int)uVar13 + (int)lVar11) * 4 + lVar3 + 0x78
                             );
            if ((int)uVar20 < (int)uVar1) {
              uVar20 = (ulong)uVar1;
            }
          }
          uVar13 = uVar13 + 0xd;
        }
        *(int *)(lVar19 * 0x18 + ((long)(uVar15 * 0x2400000000) >> 0x1e) + local_58 + lVar21 * 4) =
             (int)uVar20;
        uVar17 = uVar17 + 2;
      }
      uVar8 = uVar8 + 0x1a;
    }
    uVar16 = uVar16 + 0xa9;
  }
  for (uVar7 = 0; uVar7 < (pCVar4->model_binary_0DQ).FC1.outputNum; uVar7 = uVar7 + 1) {
    uVar6 = (pCVar4->model_binary_0DQ).FC1.inputNum;
    iVar14 = 0;
    for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
      iVar14 = iVar14 + Binary0DQ_FC1_Map_Weight[uVar6 * (int)uVar7 + (int)uVar16] *
                        *(int *)(local_58 + uVar16 * 4);
    }
    iVar18 = Binary0DQ_FC1_B_Weight[uVar7];
    *(undefined8 *)(lVar10 + -8) = 0x1026e1;
    iVar14 = TanhApproximateFunction(iVar14 + iVar18);
    *(int *)(lVar12 + uVar7 * 4) = iVar14;
  }
  iVar14 = -10000;
  uVar7 = 0;
  for (uVar16 = 0; uVar16 != (pCVar4->model_binary_0DQ).FC2.outputNum; uVar16 = uVar16 + 1) {
    uVar6 = (pCVar4->model_binary_0DQ).FC2.inputNum;
    iVar18 = 0;
    for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
      iVar18 = iVar18 + Binary0DQ_FC2_Map_Weight[uVar6 * (int)uVar16 + (int)uVar15] *
                        *(int *)(lVar12 + uVar15 * 4);
    }
    if (iVar14 < iVar18 + Binary0DQ_FC2_B_Weight[uVar16]) {
      uVar7 = uVar16 & 0xffffffff;
      iVar14 = iVar18 + Binary0DQ_FC2_B_Weight[uVar16];
    }
  }
  *(undefined8 *)(lVar10 + -8) = 0xd;
  uVar2 = *(undefined8 *)(lVar10 + -8);
  *(undefined8 *)(lVar10 + -8) = 0x19;
  CVar5 = (CHAR)*(undefined8 *)(lVar10 + -8);
  if ((int)uVar7 == 1) {
    CVar5 = (CHAR)uVar2;
  }
  if ((int)uVar7 == 0) {
    CVar5 = (CHAR)uVar7;
  }
  return CVar5;
}

Assistant:

CHAR CNNModelPredictBinary0DQ(CharCNNClassifier *model, IplImage *pImage) {
    int row, col, i, j, k;
    INT8U output_row, output_col;
    int map_index_position, image_index_position;
    int sum, max, value;
    int c11_output[model->model_binary_0DQ.C11.outChannels * 13 * 13];
//    int c21_output[25 * 11 * 11], c31_output[25 * 9 * 9];
    int merge_output[model->model_binary_0DQ.FC1.inputNum];
    int fc1_output[model->model_binary_0DQ.FC1.outputNum];
// convolution - layer
//    3*3
//    15-3+1=13
    output_row = 13;
    output_col = 13;
    for (k = 0; k < model->model_binary_0DQ.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                sum = 0;
                for (row = 0; row < model->model_binary_0DQ.C11.height; row++) {
                    for (col = 0; col < model->model_binary_0DQ.C11.widthStep; col++) {
                        //      index position
                        map_index_position = k * 3 * 3 + row * model->model_binary_0DQ.C11.widthStep + col;
                        image_index_position = (i + row) * pImage->widthStep + (j + col);
//                        printf("%d,%d\n", map_index_position, image_index_position);
//                        printf("%ld,%d,%ld\n", C11_Map_Weight[map_index_position],
//                               pImage->imageData[image_index_position],
//                               C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position]);
                        sum += Binary0DQ_C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position];
                    }
                }
                c11_output[k * output_row * output_row + i * output_row + j] = TanhApproximateFunction(
                        sum + Binary0DQ_C11_B_Weight[k]);
//                printf("%ld\n",sum + C11_B_Weight[k]);
            }
        }
//        printmat2(c11_output, 13, 13);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }


    output_row = 6;
    output_col = 6;
    for (k = 0; k < model->model_binary_0DQ.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                max = -10;
                for (row = 0; row < 2; row++) {
                    for (col = 0; col < 2; col++) {
                        value = c11_output[k * 13 * 13 + (2 * i + row) * 13 + (2 * j + col)];
                        if (value > max) {
                            max = value;
                        }

                    }
                }
                merge_output[k * 6 * 6 + i * 6 + j] = max;
            }
        }
//        printmat2(merge_output, 6, 6);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }
    //endregion


    //region FC1 - 360*40

    for (row = 0; row < model->model_binary_0DQ.FC1.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_0DQ.FC1.inputNum; col++) {
            sum += merge_output[col] * Binary0DQ_FC1_Map_Weight[row * model->model_binary_0DQ.FC1.inputNum + col];
        }
//        fc1_output[row] = tanhf(sum + FC1_B_Weight[row]);
        fc1_output[row] = TanhApproximateFunction(sum + Binary0DQ_FC1_B_Weight[row]);
//        fc1_output[row] = sum + FC1_B_Weight[row];
    }
    //endregion

//    for (col = 0; col < model->model_binary_0DQ.FC2.inputNum; col++) {
//        printf("%f,",fc1_output[col]);
//    }
//    printf("\n");
//
//    for (col = 0; col < model->model_binary_0DQ.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[7*model->model_binary_0DQ.FC2.inputNum+col]);
//    }
//    printf("\n");
//    for (col = 0; col < model->model_binary_0DQ.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[33*model->model_binary_0DQ.FC2.inputNum+col]);
//    }
//    printf("\n");
    //region FC2 - 40*34
    max = -10000;
    k = 0;

    for (row = 0; row < model->model_binary_0DQ.FC2.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_0DQ.FC2.inputNum; col++) {
//            printf("%d,%d\n",fc1_output[col],FC2_Map_Weight[row * model->model_binary_0DQ.FC2.inputNum + col]);
            sum += fc1_output[col] * Binary0DQ_FC2_Map_Weight[row * model->model_binary_0DQ.FC2.inputNum + col];
        }
        value = sum + Binary0DQ_FC2_B_Weight[row];
//        printf("%ld\n",value);
        if (value > max) {
            max = value;
            k = row;
        }
    }
    //endregion

//    printf("%f,%d\n",max,k);
    if (k == 0)
        return 0;
    else if (k == 1)
        return 13;
    else
        return 25;
//    return '1' ;
}